

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::InstancedRenderingCase::setupAndRender(InstancedRenderingCase *this)

{
  GLuint program;
  pointer indices;
  GLuint GVar1;
  GLint GVar2;
  ulong uVar3;
  
  program = (this->m_program->m_program).m_program;
  glwUseProgram(program);
  GVar1 = glwGetAttribLocation(program,"a_position");
  glwEnableVertexAttribArray(GVar1);
  glwVertexAttribPointer
            (GVar1,2,0x1406,'\0',0,
             (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl
             .super__Vector_impl_data._M_start);
  if (this->m_instancingType - TYPE_ATTRIB_DIVISOR < 2) {
    if (this->m_instancingType == TYPE_ATTRIB_DIVISOR) {
      GVar1 = glwGetAttribLocation(program,"a_instanceOffset");
      glwEnableVertexAttribArray(GVar1);
      glwVertexAttribDivisor(GVar1,1);
      glwVertexAttribPointer
                (GVar1,3,0x1406,'\0',0,
                 (this->m_instanceOffsets).super__Vector_base<float,_std::allocator<float>_>._M_impl
                 .super__Vector_impl_data._M_start);
      GVar2 = glwGetAttribLocation(program,"a_instanceR");
      setupVarAttribPointer
                (this,(this->m_instanceColorR).
                      super__Vector_base<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
                      ._M_impl.super__Vector_impl_data._M_start,GVar2,3);
    }
    GVar2 = glwGetAttribLocation(program,"a_instanceG");
    setupVarAttribPointer
              (this,(this->m_instanceColorG).
                    super__Vector_base<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
                    ._M_impl.super__Vector_impl_data._M_start,GVar2,2);
    GVar2 = glwGetAttribLocation(program,"a_instanceB");
    setupVarAttribPointer
              (this,(this->m_instanceColorB).
                    super__Vector_base<deqp::gles3::Functional::vcns::VarComp,_std::allocator<deqp::gles3::Functional::vcns::VarComp>_>
                    ._M_impl.super__Vector_impl_data._M_start,GVar2,1);
  }
  if (this->m_function == FUNCTION_DRAW_ARRAYS_INSTANCED) {
    uVar3 = (long)(this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    glwDrawArraysInstanced
              (4,0,(int)(((uint)(uVar3 >> 0x21) & 1) + (int)(uVar3 >> 2)) >> 1,this->m_numInstances)
    ;
  }
  else {
    indices = (this->m_gridIndices).
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start;
    glwDrawElementsInstanced
              (4,(GLsizei)((ulong)((long)(this->m_gridIndices).
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)indices)
                          >> 1),0x1403,indices,this->m_numInstances);
  }
  glwUseProgram(0);
  return;
}

Assistant:

void InstancedRenderingCase::setupAndRender (void)
{
	deUint32 program = m_program->getProgram();

	glUseProgram(program);

	{
		// Setup attributes.

		// Position attribute is non-instanced.
		int positionLoc = glGetAttribLocation(program, "a_position");
		glEnableVertexAttribArray(positionLoc);
		glVertexAttribPointer(positionLoc, 2, GL_FLOAT, GL_FALSE, 0, &m_gridVertexPositions[0]);

		if (m_instancingType == TYPE_ATTRIB_DIVISOR || m_instancingType == TYPE_MIXED)
		{
			if (m_instancingType == TYPE_ATTRIB_DIVISOR)
			{
				// Position offset attribute is instanced with separate offset for every instance.
				int offsetLoc = glGetAttribLocation(program, "a_instanceOffset");
				glEnableVertexAttribArray(offsetLoc);
				glVertexAttribDivisor(offsetLoc, 1);
				glVertexAttribPointer(offsetLoc, OFFSET_COMPONENTS, GL_FLOAT, GL_FALSE, 0, &m_instanceOffsets[0]);

				int rLoc = glGetAttribLocation(program, "a_instanceR");
				setupVarAttribPointer((void*)&m_instanceColorR[0].u32, rLoc, ATTRIB_DIVISOR_R);
			}

			int gLoc = glGetAttribLocation(program, "a_instanceG");
			setupVarAttribPointer((void*)&m_instanceColorG[0].u32, gLoc, ATTRIB_DIVISOR_G);

			int bLoc = glGetAttribLocation(program, "a_instanceB");
			setupVarAttribPointer((void*)&m_instanceColorB[0].u32, bLoc, ATTRIB_DIVISOR_B);
		}
	}

	// Draw using appropriate function.

	if (m_function == FUNCTION_DRAW_ARRAYS_INSTANCED)
	{
		const int numPositionComponents = 2;
		glDrawArraysInstanced(GL_TRIANGLES, 0, ((int)m_gridVertexPositions.size() / numPositionComponents), m_numInstances);
	}
	else
		glDrawElementsInstanced(GL_TRIANGLES, (int)m_gridIndices.size(), GL_UNSIGNED_SHORT, &m_gridIndices[0], m_numInstances);

	glUseProgram(0);
}